

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O3

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,unsigned_long,char_const*,unsigned_long,char_const*>,0ul,1ul,2ul,3ul,4ul>
               (ostream *os,undefined8 *t)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  
  pcVar1 = (char *)t[4];
  iVar2 = (int)os;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  pcVar1 = (char *)t[2];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  pcVar1 = (char *)*t;
  if (pcVar1 != (char *)0x0) {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
    return;
  }
  std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}